

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,Point2f u)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  Float pdf;
  Float local_100;
  float local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  Tuple2<pbrt::Point2,_float> local_c8;
  float local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  Tuple3<pbrt::Point3,_float> local_98;
  Interval<float> local_88;
  Interval<float> IStack_80;
  Interval<float> IStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Point3fi local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  
  auVar21._8_56_ = in_register_00001208;
  auVar21._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_c8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar21._0_16_);
  pcVar6 = *(char **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar11 = (long)this->blpIndex * 0x10;
  lVar7 = *(long *)(pcVar6 + 0x10);
  lVar8 = *(long *)(pcVar6 + 0x18);
  pfVar1 = (float *)(lVar8 + (long)*(int *)(lVar7 + lVar11) * 0xc);
  pfVar2 = (float *)(lVar8 + (long)*(int *)(lVar7 + 4 + lVar11) * 0xc);
  pfVar3 = (float *)(lVar8 + (long)*(int *)(lVar7 + 8 + lVar11) * 0xc);
  pfVar4 = (float *)(lVar8 + (long)*(int *)(lVar7 + 0xc + lVar11) * 0xc);
  local_100 = 1.0;
  if (*(PiecewiseConstant2D **)(pcVar6 + 0x38) == (PiecewiseConstant2D *)0x0) {
    bVar12 = IsRectangle(this);
    if (bVar12) {
      local_d8._8_8_ = 0;
      local_d8._0_4_ = local_c8.x;
      local_d8._4_4_ = local_c8.y;
    }
    else {
      fVar9 = *pfVar2 - *pfVar1;
      fVar16 = pfVar2[1] - pfVar1[1];
      fVar19 = pfVar2[2] - pfVar1[2];
      fVar17 = *pfVar3 - *pfVar1;
      fVar34 = pfVar3[1] - pfVar1[1];
      fVar18 = pfVar3[2] - pfVar1[2];
      auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar16),
                                ZEXT416((uint)(fVar19 * fVar34)));
      auVar35 = vfnmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar34)),ZEXT416((uint)fVar19),
                                 ZEXT416((uint)fVar34));
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar9 * fVar18)));
      auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar9),
                                 ZEXT416((uint)(fVar9 * fVar18)));
      fVar19 = auVar20._0_4_ + auVar26._0_4_;
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(fVar16 * fVar17)));
      auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar16),
                                 ZEXT416((uint)(fVar16 * fVar17)));
      auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar35._0_4_));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar15,auVar15);
      auVar20 = ZEXT416((uint)(auVar20._0_4_ + auVar26._0_4_));
      auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
      if (auVar15._0_4_ < 0.0) {
        local_d8._0_4_ = sqrtf(auVar15._0_4_);
      }
      else {
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        local_d8._0_4_ = auVar15._0_4_;
      }
      fVar9 = *pfVar2 - *pfVar1;
      fVar16 = pfVar2[1] - pfVar1[1];
      fVar19 = pfVar2[2] - pfVar1[2];
      fVar17 = *pfVar4 - *pfVar2;
      fVar34 = pfVar4[1] - pfVar2[1];
      fVar18 = pfVar4[2] - pfVar2[2];
      auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar16),
                                ZEXT416((uint)(fVar19 * fVar34)));
      auVar35 = vfnmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar34)),ZEXT416((uint)fVar19),
                                 ZEXT416((uint)fVar34));
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar9 * fVar18)));
      auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar9),
                                 ZEXT416((uint)(fVar9 * fVar18)));
      fVar19 = auVar20._0_4_ + auVar26._0_4_;
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(fVar16 * fVar17)));
      auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar16),
                                 ZEXT416((uint)(fVar16 * fVar17)));
      auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar35._0_4_));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar15,auVar15);
      auVar20 = ZEXT416((uint)(auVar20._0_4_ + auVar26._0_4_));
      auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
      if (auVar15._0_4_ < 0.0) {
        local_e8._0_4_ = sqrtf(auVar15._0_4_);
      }
      else {
        auVar15 = vsqrtss_avx(auVar15,auVar15);
        local_e8._0_4_ = auVar15._0_4_;
      }
      fVar9 = *pfVar3 - *pfVar1;
      fVar16 = pfVar3[1] - pfVar1[1];
      fVar19 = pfVar3[2] - pfVar1[2];
      fVar17 = *pfVar4 - *pfVar3;
      fVar34 = pfVar4[1] - pfVar3[1];
      fVar18 = pfVar4[2] - pfVar3[2];
      auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar16),
                                ZEXT416((uint)(fVar19 * fVar34)));
      auVar35 = vfnmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar34)),ZEXT416((uint)fVar19),
                                 ZEXT416((uint)fVar34));
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar9 * fVar18)));
      auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar9),
                                 ZEXT416((uint)(fVar9 * fVar18)));
      fVar19 = auVar20._0_4_ + auVar26._0_4_;
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(fVar16 * fVar17)));
      auVar26 = vfnmadd213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar16),
                                 ZEXT416((uint)(fVar16 * fVar17)));
      auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar35._0_4_));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar15,auVar15);
      auVar20 = ZEXT416((uint)(auVar20._0_4_ + auVar26._0_4_));
      auVar15 = vfmadd231ss_fma(auVar15,auVar20,auVar20);
      if (auVar15._0_4_ < 0.0) {
        auVar23._0_4_ = sqrtf(auVar15._0_4_);
        auVar23._4_60_ = extraout_var;
        auVar15 = auVar23._0_16_;
      }
      else {
        auVar15 = vsqrtss_avx(auVar15,auVar15);
      }
      fVar9 = *pfVar4 - *pfVar2;
      fVar16 = pfVar4[1] - pfVar2[1];
      fVar19 = pfVar4[2] - pfVar2[2];
      fVar17 = *pfVar4 - *pfVar3;
      fVar34 = pfVar4[1] - pfVar3[1];
      fVar18 = pfVar4[2] - pfVar3[2];
      auVar20 = vfmsub213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar16),
                                ZEXT416((uint)(fVar19 * fVar34)));
      auVar13 = vfnmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar34)),ZEXT416((uint)fVar19),
                                 ZEXT416((uint)fVar34));
      auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar19),ZEXT416((uint)fVar17),
                                ZEXT416((uint)(fVar9 * fVar18)));
      auVar35 = vfnmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar9),
                                 ZEXT416((uint)(fVar9 * fVar18)));
      fVar19 = auVar26._0_4_ + auVar35._0_4_;
      auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar34),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(fVar16 * fVar17)));
      auVar35 = vfnmadd213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar16),
                                 ZEXT416((uint)(fVar16 * fVar17)));
      auVar20 = ZEXT416((uint)(auVar20._0_4_ + auVar13._0_4_));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),auVar20,auVar20);
      auVar26 = ZEXT416((uint)(auVar26._0_4_ + auVar35._0_4_));
      auVar20 = vfmadd231ss_fma(auVar20,auVar26,auVar26);
      local_f8._0_4_ = auVar15._0_4_;
      if (auVar20._0_4_ < 0.0) {
        auVar24._0_4_ = sqrtf(auVar20._0_4_);
        auVar24._4_60_ = extraout_var_00;
        auVar15 = ZEXT416((uint)local_f8._0_4_);
        auVar20 = auVar24._0_16_;
      }
      else {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
      }
      auVar35._8_8_ = 0;
      auVar35._0_4_ = local_c8.x;
      auVar35._4_4_ = local_c8.y;
      auVar26 = vmovshdup_avx(auVar35);
      local_fc = (float)local_e8._0_4_ + (float)local_d8._0_4_;
      fVar19 = auVar15._0_4_ + auVar20._0_4_;
      fVar9 = local_fc + fVar19;
      fVar16 = auVar26._0_4_;
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar19 * fVar19)),
                                ZEXT416((uint)(local_fc * local_fc)),ZEXT416((uint)(1.0 - fVar16)));
      local_b8._0_4_ = auVar20._0_4_;
      if (auVar26._0_4_ < 0.0) {
        local_a8 = auVar35;
        fVar19 = sqrtf(auVar26._0_4_);
        auVar20 = ZEXT416((uint)local_b8._0_4_);
        auVar15 = ZEXT416((uint)local_f8._0_4_);
        auVar35 = local_a8;
      }
      else {
        auVar26 = vsqrtss_avx(auVar26,auVar26);
        fVar19 = auVar26._0_4_;
      }
      auVar26 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)((fVar16 * fVar9) / (local_fc + fVar19))));
      fVar19 = auVar26._0_4_;
      fVar9 = 1.0 - fVar19;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar19)),ZEXT416((uint)fVar9),
                                ZEXT416((uint)local_d8._0_4_));
      fVar16 = auVar13._0_4_;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar19)),ZEXT416((uint)fVar9),
                                ZEXT416((uint)local_e8._0_4_));
      fVar17 = auVar13._0_4_;
      fVar34 = auVar35._0_4_;
      fVar19 = fVar34 * (fVar16 + fVar17);
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar17 * fVar17)),
                                ZEXT416((uint)(fVar16 * fVar16)),ZEXT416((uint)(1.0 - fVar34)));
      if (auVar35._0_4_ < 0.0) {
        local_c0 = fVar19;
        local_bc = fVar16;
        local_a8 = auVar26;
        fVar17 = sqrtf(auVar35._0_4_);
        auVar20 = ZEXT416((uint)local_b8._0_4_);
        auVar15 = ZEXT416((uint)local_f8._0_4_);
        fVar16 = local_bc;
        fVar19 = local_c0;
        auVar26 = local_a8;
      }
      else {
        auVar35 = vsqrtss_avx(auVar35,auVar35);
        fVar17 = auVar35._0_4_;
      }
      auVar35 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar19 / (fVar16 + fVar17))));
      local_100 = 0.0;
      fVar19 = auVar35._0_4_;
      if ((((0.0 <= fVar19) && (fVar19 <= 1.0)) && (fVar16 = auVar26._0_4_, 0.0 <= fVar16)) &&
         (fVar16 <= 1.0)) {
        fVar17 = auVar15._0_4_ + local_fc + auVar20._0_4_;
        if ((fVar17 != 0.0) || (local_100 = 1.0, NAN(fVar17))) {
          auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_d8._0_4_),
                                    ZEXT416((uint)(fVar9 * (1.0 - fVar19))),
                                    ZEXT416((uint)(fVar9 * fVar19 * (float)local_e8._0_4_)));
          auVar15 = vfmadd213ss_fma(auVar15,ZEXT416((uint)(fVar16 * (1.0 - fVar19))),auVar13);
          auVar15 = vfmadd213ss_fma(auVar20,ZEXT416((uint)(fVar16 * fVar19)),auVar15);
          local_100 = (auVar15._0_4_ * 4.0) / fVar17;
        }
      }
      local_d8 = vinsertps_avx(auVar35,auVar26,0x10);
    }
  }
  else {
    auVar22._0_8_ =
         PiecewiseConstant2D::Sample
                   (*(PiecewiseConstant2D **)(pcVar6 + 0x38),(Point2f *)&local_c8,&local_100);
    auVar22._8_56_ = extraout_var_01;
    local_d8 = auVar22._0_16_;
  }
  auVar15 = vmovshdup_avx(local_d8);
  fVar25 = auVar15._0_4_;
  fVar16 = 1.0 - fVar25;
  fVar19 = fVar16 * *pfVar1 + fVar25 * *pfVar3;
  fVar9 = fVar16 * *pfVar2 + fVar25 * *pfVar4;
  fVar18 = local_d8._0_4_;
  fVar17 = 1.0 - fVar18;
  fVar34 = fVar9 - fVar19;
  auVar13._0_4_ =
       fVar16 * (float)*(undefined8 *)(pfVar1 + 1) + fVar25 * (float)*(undefined8 *)(pfVar3 + 1);
  auVar13._4_4_ =
       fVar16 * (float)((ulong)*(undefined8 *)(pfVar1 + 1) >> 0x20) +
       auVar15._4_4_ * (float)((ulong)*(undefined8 *)(pfVar3 + 1) >> 0x20);
  auVar13._8_4_ = fVar16 * 0.0 + auVar15._8_4_ * 0.0;
  auVar13._12_4_ = fVar16 * 0.0 + auVar15._12_4_ * 0.0;
  auVar26._0_4_ =
       fVar16 * (float)*(undefined8 *)(pfVar2 + 1) + fVar25 * (float)*(undefined8 *)(pfVar4 + 1);
  auVar26._4_4_ =
       fVar16 * (float)((ulong)*(undefined8 *)(pfVar2 + 1) >> 0x20) +
       auVar15._4_4_ * (float)((ulong)*(undefined8 *)(pfVar4 + 1) >> 0x20);
  auVar26._8_4_ = fVar16 * 0.0 + auVar15._8_4_ * 0.0;
  auVar26._12_4_ = fVar16 * 0.0 + auVar15._12_4_ * 0.0;
  auVar15 = vmovshdup_avx(auVar13);
  auVar20 = vmovshdup_avx(auVar26);
  local_98.z = auVar20._0_4_ * fVar18 + fVar17 * auVar15._0_4_;
  auVar15 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar19 + fVar18 * fVar9)),
                          ZEXT416((uint)(fVar17 * auVar13._0_4_ + fVar18 * auVar26._0_4_)),0x10);
  local_98._0_8_ = vmovlps_avx(auVar15);
  auVar20 = vsubps_avx(auVar26,auVar13);
  auVar15 = vmovshdup_avx(auVar20);
  fVar19 = auVar20._0_4_;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),ZEXT416((uint)fVar34),
                            ZEXT416((uint)fVar34));
  auVar15 = vfmadd231ss_fma(auVar26,auVar15,auVar15);
  if ((auVar15._0_4_ != 0.0) || (NAN(auVar15._0_4_))) {
    auVar15 = vinsertps_avx(ZEXT416((uint)pfVar3[2]),ZEXT416((uint)*pfVar3),0x10);
    auVar26 = vinsertps_avx(ZEXT416((uint)pfVar4[2]),ZEXT416((uint)*pfVar4),0x10);
    auVar32._0_4_ = auVar26._0_4_ * fVar18 + fVar17 * auVar15._0_4_;
    auVar32._4_4_ = auVar26._4_4_ * fVar18 + fVar17 * auVar15._4_4_;
    auVar32._8_4_ = auVar26._8_4_ * fVar18 + fVar17 * auVar15._8_4_;
    auVar32._12_4_ = auVar26._12_4_ * fVar18 + fVar17 * auVar15._12_4_;
    auVar15 = vinsertps_avx(ZEXT416((uint)pfVar1[2]),ZEXT416((uint)*pfVar1),0x10);
    auVar26 = vinsertps_avx(ZEXT416((uint)pfVar2[2]),ZEXT416((uint)*pfVar2),0x10);
    auVar14._0_4_ = auVar15._0_4_ * fVar17 + fVar18 * auVar26._0_4_;
    auVar14._4_4_ = auVar15._4_4_ * fVar17 + fVar18 * auVar26._4_4_;
    auVar14._8_4_ = auVar15._8_4_ * fVar17 + fVar18 * auVar26._8_4_;
    auVar14._12_4_ = auVar15._12_4_ * fVar17 + fVar18 * auVar26._12_4_;
    auVar26 = vsubps_avx(auVar32,auVar14);
    fVar9 = (fVar17 * pfVar3[1] + fVar18 * pfVar4[1]) - (fVar18 * pfVar2[1] + fVar17 * pfVar1[1]);
    auVar15 = vmovshdup_avx(auVar26);
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar15,auVar15);
    auVar35 = vfmadd231ss_fma(auVar35,auVar26,auVar26);
    if ((auVar35._0_4_ != 0.0) || (NAN(auVar35._0_4_))) {
      auVar13 = vpermi2ps_avx512vl(_DAT_005c8630,auVar20,ZEXT416((uint)fVar34));
      auVar14 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar26,ZEXT416((uint)fVar9));
      auVar33._0_4_ = auVar13._0_4_ * auVar14._0_4_;
      auVar33._4_4_ = auVar13._4_4_ * auVar14._4_4_;
      auVar33._8_4_ = auVar13._8_4_ * auVar14._8_4_;
      auVar33._12_4_ = auVar13._12_4_ * auVar14._12_4_;
      auVar32 = ZEXT416((uint)(fVar19 * auVar15._0_4_));
      auVar35 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar34),auVar32);
      auVar15 = vfnmadd213ss_fma(auVar15,auVar20,auVar32);
      local_f8._0_4_ = auVar35._0_4_ + auVar15._0_4_;
      auVar15 = vfmsub213ps_fma(auVar26,auVar20,auVar33);
      auVar20 = vfnmadd213ps_fma(auVar14,auVar13,auVar33);
      local_b8._0_4_ = auVar15._0_4_ + auVar20._0_4_;
      local_b8._4_4_ = auVar15._4_4_ + auVar20._4_4_;
      local_b8._8_4_ = auVar15._8_4_ + auVar20._8_4_;
      local_b8._12_4_ = auVar15._12_4_ + auVar20._12_4_;
      auVar15._0_4_ = (float)local_b8._0_4_ * (float)local_b8._0_4_;
      auVar15._4_4_ = (float)local_b8._4_4_ * (float)local_b8._4_4_;
      auVar15._8_4_ = (float)local_b8._8_4_ * (float)local_b8._8_4_;
      auVar15._12_4_ = (float)local_b8._12_4_ * (float)local_b8._12_4_;
      auVar15 = vmovshdup_avx(auVar15);
      auVar15 = vfmadd231ss_fma(auVar15,local_b8,local_b8);
      local_e8 = vfmadd231ss_fma(auVar15,ZEXT416((uint)local_f8._0_4_),ZEXT416((uint)local_f8._0_4_)
                                );
      if (local_e8._0_4_ < 0.0) {
        fVar19 = sqrtf(local_e8._0_4_);
      }
      else {
        auVar15 = vsqrtss_avx(local_e8,local_e8);
        fVar19 = auVar15._0_4_;
      }
      auVar20._4_4_ = fVar19;
      auVar20._0_4_ = fVar19;
      auVar20._8_4_ = fVar19;
      auVar20._12_4_ = fVar19;
      auVar15 = vdivps_avx(local_b8,auVar20);
      fVar19 = (float)local_f8._0_4_ / fVar19;
      bVar12 = *pcVar6 == pcVar6[1];
      local_f8 = auVar15;
      if (!bVar12) {
        local_f8._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
        local_f8._8_4_ = auVar15._8_4_ ^ 0x80000000;
        local_f8._12_4_ = auVar15._12_4_ ^ 0x80000000;
      }
      local_b8._4_4_ = 0x80000000;
      local_b8._0_4_ = (uint)bVar12 * (int)fVar19 + (uint)!bVar12 * (int)-fVar19;
      local_b8._8_4_ = 0x80000000;
      local_b8._12_4_ = 0x80000000;
      auVar15 = vinsertps_avx(ZEXT416((uint)pfVar1[2]),ZEXT416((uint)pfVar3[2]),0x10);
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx(auVar15,auVar27);
      auVar20 = vinsertps_avx(ZEXT416((uint)pfVar2[2]),ZEXT416((uint)pfVar4[2]),0x10);
      auVar20 = vandps_avx(auVar20,auVar27);
      auVar15 = vmaxps_avx(auVar20,auVar15);
      auVar20 = vmovshdup_avx(auVar15);
      auVar35 = vmaxss_avx(auVar20,auVar15);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)pfVar1;
      auVar15 = vandps_avx(auVar28,auVar27);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)pfVar2;
      auVar20 = vandps_avx(auVar29,auVar27);
      auVar26 = vmaxps_avx(auVar20,auVar15);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)pfVar3;
      auVar15 = vandps_avx(auVar30,auVar27);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)pfVar4;
      auVar20 = vandps_avx(auVar31,auVar27);
      auVar15 = vmaxps_avx(auVar20,auVar15);
      auVar15 = vmaxps_avx(auVar15,auVar26);
      auVar10._8_4_ = 0x34800002;
      auVar10._0_8_ = 0x3480000234800002;
      auVar10._12_4_ = 0x34800002;
      auVar15 = vmulps_avx512vl(auVar15,auVar10);
      local_58.z = auVar35._0_4_ * 2.3841864e-07;
      local_58._0_8_ = vmovlps_avx(auVar15);
      Point3fi::Point3fi(&local_48,(Point3f *)&local_98,(Vector3f *)&local_58);
      IStack_78 = local_48.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
      local_88 = local_48.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
      IStack_80 = local_48.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
      uStack_70 = 0;
      uStack_68 = 0;
      fVar19 = local_e8._0_4_;
      if (fVar19 < 0.0) {
        local_e8._0_4_ = local_100;
        fVar19 = sqrtf(fVar19);
        local_100 = (Float)local_e8._0_4_;
      }
      else {
        auVar15 = vsqrtss_avx(local_e8,local_e8);
        fVar19 = auVar15._0_4_;
      }
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align =
           (anon_struct_8_0_00000001_for___align)local_88;
      *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) = IStack_80;
      *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) = IStack_78;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = uStack_70;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uStack_68;
      uVar5 = vmovlps_avx(local_f8);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar5;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_b8._0_4_;
      uVar5 = vmovlps_avx(local_d8);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x34) = uVar5;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x3c) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x44) = 0;
      *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = 0;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_100 / fVar19;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Sample bilinear patch parametric $(u,v)$ coordinates
    Float pdf = 1;
    Point2f uv;
    if (mesh->imageDistribution)
        uv = mesh->imageDistribution->Sample(u, &pdf);
    else if (!IsRectangle()) {
        // Sample patch $(u,v)$ with approximate uniform area sampling
        // Initialize _w_ array with differential area at bilinear patch corners
        pstd::array<Float, 4> w = {
            Length(Cross(p10 - p00, p01 - p00)), Length(Cross(p10 - p00, p11 - p10)),
            Length(Cross(p01 - p00, p11 - p01)), Length(Cross(p11 - p10, p11 - p01))};

        uv = SampleBilinear(u, w);
        pdf = BilinearPDF(uv, w);

    } else
        uv = u;

    // Compute position, $\dpdu$, and $\dpdv$ for sampled bilinear patch $(u,v)$
    Point3f pu0 = Lerp(uv[1], p00, p01), pu1 = Lerp(uv[1], p10, p11);
    Point3f p = Lerp(uv[0], pu0, pu1);
    Vector3f dpdu = pu1 - pu0;
    Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);
    if (LengthSquared(dpdu) == 0 || LengthSquared(dpdv) == 0)
        return {};

    // Compute surface normal for sampled bilinear patch $(u,v)$
    Normal3f n = Normal3f(Normalize(Cross(dpdu, dpdv)));
    if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
        n = -n;

    // Compute _pError_ for sampled bilinear patch $(u,v)$
    Vector3f pError =
        gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

    // Return _ShapeSample_ for sampled bilinear patch point
    return ShapeSample{Interaction(Point3fi(p, pError), n, uv),
                       pdf / Length(Cross(dpdu, dpdv))};
}